

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O1

JL_STATUS JlCreateNumberF64Object(double NumberF64,JlDataObject **pNumberObject)

{
  JL_STATUS JVar1;
  JlDataObject *numberObject;
  JlDataObject *local_20;
  double local_18;
  
  local_20 = (JlDataObject *)0x0;
  if (pNumberObject == (JlDataObject **)0x0) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pNumberObject = (JlDataObject *)0x0;
    local_18 = NumberF64;
    JVar1 = JlCreateObject(JL_DATA_TYPE_NUMBER,&local_20);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlSetObjectNumberF64(local_20,local_18);
      if (JVar1 == JL_STATUS_SUCCESS) {
        *pNumberObject = local_20;
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JlFreeObjectTree(&local_20);
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlCreateNumberF64Object
    (
        double              NumberF64,          // [in]
        JlDataObject**      pNumberObject       // [out]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* numberObject = NULL;

    if( NULL != pNumberObject )
    {
        *pNumberObject = NULL;

        jlStatus = JlCreateObject( JL_DATA_TYPE_NUMBER, &numberObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlSetObjectNumberF64( numberObject, NumberF64 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pNumberObject = numberObject;
            }
            else
            {
                JlFreeObjectTree( &numberObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}